

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall TTD::ThreadContextTTD::CleanRecordWeakRootMap(ThreadContextTTD *this)

{
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *pWVar1;
  ThreadContextTTD *this_local;
  
  pWVar1 = Memory::
           RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
           ::operator->(&this->m_ttdRecordRootWeakMap);
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
  ::Map<TTD::ThreadContextTTD::CleanRecordWeakRootMap()::__0>
            ((WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
              *)pWVar1);
  return;
}

Assistant:

void ThreadContextTTD::CleanRecordWeakRootMap()
    {
        this->m_ttdRecordRootWeakMap->Map([&](Js::RecyclableObject* key, bool, const RecyclerWeakReference<Js::RecyclableObject>*)
        {
            ; //nop just map to force the clean
        });
    }